

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pattern_formatter.h
# Opt level: O1

void __thiscall
spdlog::details::pid_formatter::format
          (pid_formatter *this,log_msg *param_1,tm *param_2,memory_buffer *dest)

{
  uint uVar1;
  char *pcVar2;
  char *__src;
  uint uVar3;
  ptrdiff_t _Num;
  size_t sVar4;
  ulong uVar5;
  scoped_pad p;
  scoped_pad sStack_78;
  format_int local_50;
  
  uVar1 = getpid();
  if ((this->super_flag_formatter).padinfo_.width_ == 0) {
    __src = fmt::v5::format_int::format_decimal((format_int *)&sStack_78,(ulong)uVar1);
    pcVar2 = (char *)((long)&sStack_78.total_pad_ + 5);
    sVar4 = (long)pcVar2 - (long)__src;
    uVar5 = (dest->super_basic_buffer<char>).size_ + sVar4;
    sStack_78.spaces_.data_ = __src;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar5);
    }
    if (pcVar2 != __src) {
      memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,__src,
              sVar4);
    }
    (dest->super_basic_buffer<char>).size_ = uVar5;
  }
  else {
    uVar3 = 0x1f;
    if ((uVar1 | 1) != 0) {
      for (; (uVar1 | 1) >> uVar3 == 0; uVar3 = uVar3 - 1) {
      }
    }
    uVar3 = (uVar3 ^ 0xffffffe0) * 0x4d1 + 0x9ef1 >> 0xc;
    scoped_pad::scoped_pad
              (&sStack_78,
               (ulong)((uVar3 - (uVar1 < *(uint *)(fmt::v5::internal::basic_data<void>::
                                                   ZERO_OR_POWERS_OF_10_32 + (ulong)uVar3 * 4))) + 1
                      ),&(this->super_flag_formatter).padinfo_,dest);
    pcVar2 = fmt::v5::format_int::format_decimal(&local_50,(ulong)uVar1);
    sVar4 = (long)(local_50.buffer_ + 0x15) - (long)pcVar2;
    uVar5 = (dest->super_basic_buffer<char>).size_ + sVar4;
    local_50.str_ = pcVar2;
    if ((dest->super_basic_buffer<char>).capacity_ < uVar5) {
      (**(dest->super_basic_buffer<char>)._vptr_basic_buffer)(dest,uVar5);
    }
    if (local_50.buffer_ + 0x15 != pcVar2) {
      memmove((dest->super_basic_buffer<char>).ptr_ + (dest->super_basic_buffer<char>).size_,pcVar2,
              sVar4);
    }
    (dest->super_basic_buffer<char>).size_ = uVar5;
    scoped_pad::~scoped_pad(&sStack_78);
  }
  return;
}

Assistant:

void format(const details::log_msg &, const std::tm &, fmt::memory_buffer &dest) override
    {
        const auto pid = static_cast<uint32_t>(details::os::pid());
        if (padinfo_.enabled())
        {
            auto field_size = fmt_helper::count_digits(pid);
            scoped_pad p(field_size, padinfo_, dest);
            fmt_helper::append_int(pid, dest);
        }
        else
        {
            fmt_helper::append_int(pid, dest);
        }
    }